

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

player_shape * lookup_player_shape(char *name)

{
  int iVar1;
  player_shape *local_20;
  player_shape *shape;
  char *name_local;
  
  local_20 = shapes;
  while( true ) {
    if (local_20 == (player_shape *)0x0) {
      msg("Could not find %s shape!",name);
      return (player_shape *)0x0;
    }
    iVar1 = strcmp(local_20->name,name);
    if (iVar1 == 0) break;
    local_20 = local_20->next;
  }
  return local_20;
}

Assistant:

struct player_shape *lookup_player_shape(const char *name)
{
	struct player_shape *shape = shapes;
	while (shape) {
		if (streq(shape->name, name)) {
			return shape;
		}
		shape = shape->next;
	}
	msg("Could not find %s shape!", name);
	return NULL;
}